

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

bool __thiscall SVGChart::PPlot::Draw(PPlot *this,Painter *inPainter)

{
  PCalculator *pPVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  long lVar7;
  ulong uVar8;
  reference ppPVar9;
  reference ppPVar10;
  PDrawer *thePostDrawer;
  __normal_iterator<SVGChart::PDrawer_**,_std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>_>
  local_100;
  iterator thePost;
  int theI;
  PDrawer *thePreDrawer_1;
  __normal_iterator<SVGChart::PDrawer_**,_std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>_>
  local_d8;
  iterator thePre;
  PRect fullRect;
  PDrawer *thePreDrawer;
  __normal_iterator<SVGChart::PDrawer_**,_std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>_>
  local_98;
  iterator thePre1;
  PCalculator *thePostCalculator;
  __normal_iterator<SVGChart::PCalculator_**,_std::vector<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>_>
  local_78;
  iterator thePostC;
  PCalculator *theModifyingCalculator;
  __normal_iterator<SVGChart::PCalculator_**,_std::vector<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>_>
  local_58;
  iterator theModifyingC;
  long theRepeatCount;
  undefined1 auStack_40 [7];
  bool theShouldRepeat;
  PRect theRect;
  Painter *inPainter_local;
  PPlot *this_local;
  
  theRect.mH = (long)inPainter;
  PRect::PRect((PRect *)auStack_40);
  _auStack_40 = (this->mMargins).mLeft;
  theRect.mX = (this->mMargins).mTop;
  lVar7 = (**(code **)(*(long *)theRect.mH + 0x20))();
  theRect.mY = (lVar7 - (this->mMargins).mLeft) - (this->mMargins).mRight;
  lVar7 = (**(code **)(*(long *)theRect.mH + 0x28))();
  theRect.mW = (lVar7 - (this->mMargins).mTop) - (this->mMargins).mBottom;
  if (this->mPPlotDrawer == (PDrawer *)0x0) {
    iVar3 = PlotDataContainer::GetPlotCount(&this->mPlotDataContainer);
    if (iVar3 == 0) {
      this_local._7_1_ = true;
    }
    else {
      uVar4 = (*(this->super_PDrawer)._vptr_PDrawer[0x10])();
      if ((uVar4 & 1) == 0) {
        this_local._7_1_ = false;
      }
      else {
        theModifyingC._M_current = (PCalculator **)0x0;
        while ((long)theModifyingC._M_current < 2) {
          theModifyingC._M_current = theModifyingC._M_current + 1;
          uVar4 = (*(this->super_PDrawer)._vptr_PDrawer[0x11])();
          if ((uVar4 & 1) == 0) {
            return false;
          }
          uVar4 = (*(this->super_PDrawer)._vptr_PDrawer[0x12])();
          if ((uVar4 & 1) == 0) {
            return false;
          }
          uVar4 = (*(this->super_PDrawer)._vptr_PDrawer[0x13])(this,&this->mXAxisSetup);
          if ((uVar4 & 1) == 0) {
            return false;
          }
          uVar4 = (*(this->super_PDrawer)._vptr_PDrawer[0x13])(this,&this->mYAxisSetup);
          if ((uVar4 & 1) == 0) {
            return false;
          }
          uVar4 = (*(this->super_PDrawer)._vptr_PDrawer[10])(this,auStack_40,theRect.mH);
          if ((uVar4 & 1) == 0) {
            return false;
          }
          uVar4 = (*(this->super_PDrawer)._vptr_PDrawer[4])(this,auStack_40);
          if ((uVar4 & 1) == 0) {
            return false;
          }
          uVar4 = (*(this->super_PDrawer)._vptr_PDrawer[5])(this,auStack_40);
          if ((uVar4 & 1) == 0) {
            return false;
          }
          if (1 < (long)theModifyingC._M_current) break;
          local_58._M_current =
               (PCalculator **)
               std::vector<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>::begin
                         (&this->mModifyingCalculatorList);
          while( true ) {
            theModifyingCalculator =
                 (PCalculator *)
                 std::vector<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>::end
                           (&this->mModifyingCalculatorList);
            bVar2 = __gnu_cxx::operator!=
                              (&local_58,
                               (__normal_iterator<SVGChart::PCalculator_**,_std::vector<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>_>
                                *)&theModifyingCalculator);
            if (!bVar2) break;
            ppPVar9 = __gnu_cxx::
                      __normal_iterator<SVGChart::PCalculator_**,_std::vector<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>_>
                      ::operator*(&local_58);
            pPVar1 = *ppPVar9;
            uVar8 = (**(code **)(*(long *)pPVar1 + 0x10))();
            if ((uVar8 & 1) != 0) {
              (**(code **)(*(long *)pPVar1 + 0x18))(pPVar1,theRect.mH,this);
              this->mHasAnyModifyingCalculatorBeenActive = true;
            }
            thePostC._M_current =
                 (PCalculator **)
                 __gnu_cxx::
                 __normal_iterator<SVGChart::PCalculator_**,_std::vector<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>_>
                 ::operator++(&local_58,0);
          }
        }
        local_78._M_current =
             (PCalculator **)
             std::vector<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>::begin
                       (&this->mPostCalculatorList);
        while( true ) {
          thePostCalculator =
               (PCalculator *)
               std::vector<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>::end
                         (&this->mPostCalculatorList);
          bVar2 = __gnu_cxx::operator!=
                            (&local_78,
                             (__normal_iterator<SVGChart::PCalculator_**,_std::vector<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>_>
                              *)&thePostCalculator);
          if (!bVar2) break;
          ppPVar9 = __gnu_cxx::
                    __normal_iterator<SVGChart::PCalculator_**,_std::vector<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>_>
                    ::operator*(&local_78);
          (**(code **)(*(long *)*ppPVar9 + 0x18))(*ppPVar9,theRect.mH,this);
          thePre1._M_current =
               (PDrawer **)
               __gnu_cxx::
               __normal_iterator<SVGChart::PCalculator_**,_std::vector<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>_>
               ::operator++(&local_78,0);
        }
        local_98._M_current =
             (PDrawer **)
             std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>::begin
                       (&this->mPreDrawerList);
        while( true ) {
          thePreDrawer = (PDrawer *)
                         std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>::end
                                   (&this->mPreDrawerList);
          bVar2 = __gnu_cxx::operator!=
                            (&local_98,
                             (__normal_iterator<SVGChart::PDrawer_**,_std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>_>
                              *)&thePreDrawer);
          if (!bVar2) break;
          ppPVar10 = __gnu_cxx::
                     __normal_iterator<SVGChart::PDrawer_**,_std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>_>
                     ::operator*(&local_98);
          (*(*ppPVar10)->_vptr_PDrawer[2])(*ppPVar10,theRect.mH,this);
          __gnu_cxx::
          __normal_iterator<SVGChart::PDrawer_**,_std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>_>
          ::operator++(&local_98,0);
        }
        (**(code **)(*(long *)theRect.mH + 0x30))(theRect.mH,0,0);
        lVar7 = theRect.mH;
        uVar5 = (**(code **)(*(long *)theRect.mH + 0x20))();
        uVar6 = (**(code **)(*(long *)theRect.mH + 0x28))();
        (**(code **)(*(long *)lVar7 + 0x18))(lVar7,0,0,uVar5,uVar6);
        PRect::PRect((PRect *)&thePre);
        thePre._M_current = (PDrawer **)0x0;
        (**(code **)(*(long *)theRect.mH + 0x20))();
        (**(code **)(*(long *)theRect.mH + 0x28))();
        uVar4 = (*(this->super_PDrawer)._vptr_PDrawer[0xb])(this,&thePre,theRect.mH);
        if ((uVar4 & 1) == 0) {
          this_local._7_1_ = false;
        }
        else {
          local_d8._M_current =
               (PDrawer **)
               std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>::begin
                         (&this->mPreDrawerList);
          while( true ) {
            thePreDrawer_1 =
                 (PDrawer *)
                 std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>::end
                           (&this->mPreDrawerList);
            bVar2 = __gnu_cxx::operator!=
                              (&local_d8,
                               (__normal_iterator<SVGChart::PDrawer_**,_std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>_>
                                *)&thePreDrawer_1);
            if (!bVar2) break;
            ppPVar10 = __gnu_cxx::
                       __normal_iterator<SVGChart::PDrawer_**,_std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>_>
                       ::operator*(&local_d8);
            (*(*ppPVar10)->_vptr_PDrawer[3])();
            __gnu_cxx::
            __normal_iterator<SVGChart::PDrawer_**,_std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>_>
            ::operator++(&local_d8,0);
          }
          uVar4 = (*(this->super_PDrawer)._vptr_PDrawer[6])(this,auStack_40,theRect.mH);
          if ((uVar4 & 1) == 0) {
            this_local._7_1_ = false;
          }
          else {
            uVar4 = (*(this->super_PDrawer)._vptr_PDrawer[7])(this,auStack_40,theRect.mH);
            if ((uVar4 & 1) == 0) {
              this_local._7_1_ = false;
            }
            else {
              uVar4 = (*(this->super_PDrawer)._vptr_PDrawer[8])(this,auStack_40,theRect.mH);
              if ((uVar4 & 1) == 0) {
                this_local._7_1_ = false;
              }
              else {
                uVar4 = (*(this->super_PDrawer)._vptr_PDrawer[9])(this,auStack_40,theRect.mH);
                if ((uVar4 & 1) == 0) {
                  this_local._7_1_ = false;
                }
                else {
                  uVar4 = (*(this->super_PDrawer)._vptr_PDrawer[0xe])(this,auStack_40,theRect.mH);
                  if ((uVar4 & 1) == 0) {
                    this_local._7_1_ = false;
                  }
                  else {
                    (**(code **)(*(long *)theRect.mH + 0x18))
                              (theRect.mH,_auStack_40 & 0xffffffff,theRect.mX & 0xffffffff,
                               theRect.mY & 0xffffffff,theRect.mW & 0xffffffff);
                    for (thePost._M_current._4_4_ = 0; uVar4 = thePost._M_current._4_4_,
                        iVar3 = PlotDataContainer::GetPlotCount(&this->mPlotDataContainer),
                        (int)uVar4 < iVar3; thePost._M_current._4_4_ = thePost._M_current._4_4_ + 1)
                    {
                      uVar4 = (*(this->super_PDrawer)._vptr_PDrawer[0xf])
                                        (this,(ulong)thePost._M_current._4_4_,auStack_40,theRect.mH)
                      ;
                      if ((uVar4 & 1) == 0) {
                        return false;
                      }
                    }
                    local_100._M_current =
                         (PDrawer **)
                         std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>::
                         begin(&this->mPostDrawerList);
                    while( true ) {
                      thePostDrawer =
                           (PDrawer *)
                           std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>::
                           end(&this->mPostDrawerList);
                      bVar2 = __gnu_cxx::operator!=
                                        (&local_100,
                                         (__normal_iterator<SVGChart::PDrawer_**,_std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>_>
                                          *)&thePostDrawer);
                      if (!bVar2) break;
                      ppPVar10 = __gnu_cxx::
                                 __normal_iterator<SVGChart::PDrawer_**,_std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>_>
                                 ::operator*(&local_100);
                      (*(*ppPVar10)->_vptr_PDrawer[3])();
                      __gnu_cxx::
                      __normal_iterator<SVGChart::PDrawer_**,_std::vector<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>_>
                      ::operator++(&local_100,0);
                    }
                    this_local._7_1_ = true;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    (*this->mPPlotDrawer->_vptr_PDrawer[2])(this->mPPlotDrawer,theRect.mH);
    iVar3 = (*this->mPPlotDrawer->_vptr_PDrawer[3])(this->mPPlotDrawer,theRect.mH);
    this_local._7_1_ = (bool)((byte)iVar3 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool PPlot::Draw (Painter &inPainter) {
      PRect theRect;
      theRect.mX = mMargins.mLeft;
      theRect.mY = mMargins.mTop;
      theRect.mW = inPainter.GetWidth () - mMargins.mLeft - mMargins.mRight;
      theRect.mH = inPainter.GetHeight () - mMargins.mTop - mMargins.mBottom;

      if (mPPlotDrawer) {
        mPPlotDrawer->Prepare (inPainter, *this);
        return mPPlotDrawer->Draw (inPainter);
      }
      if (!mPlotDataContainer.GetPlotCount ()) {
        return true;
      }

      if (!ConfigureSelf ()) {
        return false;
      }
      bool theShouldRepeat = true;
      long theRepeatCount = 0;

      while (theShouldRepeat && theRepeatCount<2) {
        theRepeatCount++;

        if (!ValidateData ()) {
          return false;
        }

        if (!CalculateAxisRanges ()) {
          return false;
        }

        if (!this->CheckRange (mXAxisSetup)) {
          return false;
        }

        if (!this->CheckRange (mYAxisSetup)) {
          return false;
        }

        if (!CalculateTickInfo (theRect, inPainter)) {
          return false;
        }

        if (!CalculateXTransformation (theRect)) {
          return false;
        }

        if (!CalculateYTransformation (theRect)) {
          return false;
        }
        if (theRepeatCount>1) {
          break;
        }
        // hooks for some final calculations
        //bool theShouldRepeat = false;
        for (PCalculator::tList::iterator theModifyingC=mModifyingCalculatorList.begin ();theModifyingC!=mModifyingCalculatorList.end();theModifyingC++) {
          PCalculator *theModifyingCalculator = *theModifyingC;
          if (theModifyingCalculator->ShouldCalculate ()) {
            //theShouldRepeat = true;
            theModifyingCalculator->Calculate (inPainter, *this);
            mHasAnyModifyingCalculatorBeenActive = true;
          }
        }
    //    theShouldRepeat = mModifyingCalculatorList.size ()>0;
      }

      // hooks for some final calculations
      for (PCalculator::tList::iterator thePostC=mPostCalculatorList.begin ();thePostC!=mPostCalculatorList.end();thePostC++) {
        PCalculator *thePostCalculator = *thePostC;
        thePostCalculator->Calculate (inPainter, *this);
      }

      for (PDrawer::tList::iterator thePre1=mPreDrawerList.begin();thePre1!=mPreDrawerList.end ();thePre1++) {
        PDrawer *thePreDrawer = *thePre1;
        thePreDrawer->Prepare (inPainter, *this);
      }

      // Drawing !

      inPainter.SetLineColor (0,0,0);
      inPainter.SetClipRect (0, 0, inPainter.GetWidth (), inPainter.GetHeight ());

      // draw entire background, including the margins (for scrolling...)
      PRect fullRect;
      fullRect.mX = 0;
      fullRect.mY = 0;
      fullRect.mW = inPainter.GetWidth ();
      fullRect.mH = inPainter.GetHeight ();
      if (!DrawPlotBackground (fullRect, inPainter)) {
        return false;
      }

      for (PDrawer::tList::iterator thePre=mPreDrawerList.begin ();thePre!=mPreDrawerList.end();thePre++) {
        PDrawer *thePreDrawer = *thePre;
        thePreDrawer->Draw (inPainter);
      }


      if (!DrawGridXAxis (theRect, inPainter)) {
        return false;
      }
      
      if (!DrawGridYAxis (theRect, inPainter)) {
        return false;
      }
      
      if (!DrawXAxis (theRect, inPainter)) {
        return false;
      }

      if (!DrawYAxis (theRect, inPainter)) {
        return false;
      }

      if (!DrawLegend (theRect, inPainter)) {
        return false;
      }

      // clip the plotregion while drawing plots
      inPainter.SetClipRect (theRect.mX, theRect.mY, theRect.mW, theRect.mH);


      for (int theI=0;theI<mPlotDataContainer.GetPlotCount ();theI++) {
        if (!DrawPlot (theI, theRect, inPainter)) {
          return false;
        }
      }

      for (PDrawer::tList::iterator thePost=mPostDrawerList.begin ();thePost!=mPostDrawerList.end();thePost++) {
        PDrawer *thePostDrawer = *thePost;
        thePostDrawer->Draw (inPainter);
      }

      return true;
    }